

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

bool __thiscall
miniros::MasterLink::getParamImpl<float>
          (MasterLink *this,string *key,vector<float,_std::allocator<float>_> *vec,bool cached)

{
  bool bVar1;
  int iVar2;
  XmlRpcValue *pXVar3;
  long lVar4;
  float fVar5;
  RpcValue xml_array;
  RpcValue local_48;
  XmlRpcValue local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_48,cached);
  if (bVar1 && local_48._type == TypeArray) {
    iVar2 = XmlRpc::XmlRpcValue::size(&local_48);
    std::vector<float,_std::allocator<float>_>::resize(vec,(long)iVar2);
    lVar4 = 0;
    while( true ) {
      iVar2 = XmlRpc::XmlRpcValue::size(&local_48);
      bVar1 = iVar2 <= lVar4;
      if (iVar2 <= lVar4) break;
      pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_48,(int)lVar4);
      if (2 < pXVar3->_type - TypeBoolean) break;
      pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_48,(int)lVar4);
      local_38._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_38,pXVar3);
      fVar5 = xml_cast<float>(&local_38);
      *(float *)(*(long *)vec + lVar4 * 4) = fVar5;
      XmlRpc::XmlRpcValue::invalidate(&local_38);
      lVar4 = lVar4 + 1;
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_48);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::vector<T>& vec, bool cached)
{
  RpcValue xml_array;
  if (!getParamImpl(key, xml_array, cached)) {
    return false;
  }

  // Make sure it's an array type
  if (xml_array.getType() != RpcValue::TypeArray) {
    return false;
  }

  // Resize the target vector (destructive)
  vec.resize(xml_array.size());

  // Fill the vector with stuff
  for (int i = 0; i < xml_array.size(); i++) {
    if (!xml_castable<T>(xml_array[i].getType())) {
      return false;
    }

    vec[i] = xml_cast<T>(xml_array[i]);
  }

  return true;
}